

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

int run_test_fs_poll(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  char *in_RCX;
  void *__s1;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_fs_poll_t *loop;
  char *path;
  undefined8 in_R9;
  undefined8 uStack_4e0;
  char acStack_4d8 [1024];
  code *pcStack_d8;
  undefined1 auStack_c8 [160];
  uv_loop_t *puStack_28;
  
  ::loop = uv_default_loop();
  remove("testfile");
  iVar3 = 0x310900;
  loop = (uv_fs_poll_t *)::loop;
  iVar1 = uv_timer_init(::loop,&timer_handle);
  if (iVar1 == 0) {
    iVar3 = 0x310998;
    loop = (uv_fs_poll_t *)::loop;
    iVar1 = uv_fs_poll_init(::loop,&poll_handle);
    if (iVar1 != 0) goto LAB_00157f1d;
    loop = &poll_handle;
    iVar3 = 0x157f40;
    in_RCX = (char *)0x64;
    iVar1 = uv_fs_poll_start(&poll_handle,poll_cb,"testfile",100);
    if (iVar1 != 0) goto LAB_00157f22;
    iVar3 = 0;
    loop = (uv_fs_poll_t *)::loop;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00157f27;
    if (poll_cb_called != 5) goto LAB_00157f2c;
    if (timer_cb_called != 2) goto LAB_00157f31;
    if (close_cb_called != 1) goto LAB_00157f36;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    loop = (uv_fs_poll_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_poll_cold_1();
LAB_00157f1d:
    run_test_fs_poll_cold_2();
LAB_00157f22:
    run_test_fs_poll_cold_3();
LAB_00157f27:
    run_test_fs_poll_cold_4();
LAB_00157f2c:
    run_test_fs_poll_cold_5();
LAB_00157f31:
    run_test_fs_poll_cold_6();
LAB_00157f36:
    run_test_fs_poll_cold_7();
  }
  run_test_fs_poll_cold_8();
  pcStack_d8 = (code *)0x157f69;
  puStack_28 = unaff_RBX;
  memset(auStack_c8,0,0xa0);
  if (loop == &poll_handle) {
    pcStack_d8 = (code *)0x157f85;
    iVar1 = uv_is_active((uv_handle_t *)&poll_handle);
    if (iVar1 != 1) goto LAB_0015819a;
    if (__s1 == (void *)0x0) goto LAB_0015819f;
    if (in_RCX == (char *)0x0) goto LAB_001581a4;
    iVar1 = poll_cb_called + 1;
    switch(poll_cb_called) {
    case 0:
      poll_cb_called = iVar1;
      if (iVar3 != -2) goto LAB_001581b8;
      pcStack_d8 = (code *)0x157fe4;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 != 0) goto LAB_001581d1;
      pcStack_d8 = (code *)0x157ffe;
      path = in_RCX;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 == 0) {
        touch_file(path);
        return extraout_EAX;
      }
      goto LAB_001581ea;
    case 1:
      poll_cb_called = iVar1;
      if (iVar3 != 0) goto LAB_001581bd;
      pcStack_d8 = (code *)0x158147;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 != 0) goto LAB_001581d6;
      pcStack_d8 = (code *)0x158161;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_001581ef;
      pcStack_d8 = (code *)0x158183;
      iVar1 = uv_timer_start(&timer_handle,timer_cb,0x14,0);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001581f4;
    case 2:
      poll_cb_called = iVar1;
      if (iVar3 != 0) goto LAB_001581ae;
      pcStack_d8 = (code *)0x15808f;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_001581c7;
      pcStack_d8 = (code *)0x1580a9;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 != 0) {
        pcStack_d8 = (code *)0x1580cb;
        iVar1 = uv_timer_start(&timer_handle,timer_cb,200,0);
        if (iVar1 == 0) {
          return 0;
        }
        pcStack_d8 = (code *)0x1580d8;
        poll_cb_cold_10();
        iVar1 = poll_cb_called;
        goto switchD_00157fc7_caseD_3;
      }
      goto LAB_001581e0;
    case 3:
switchD_00157fc7_caseD_3:
      poll_cb_called = iVar1;
      if (iVar3 != 0) goto LAB_001581b3;
      pcStack_d8 = (code *)0x1580f2;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_001581cc;
      pcStack_d8 = (code *)0x15810c;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 != 0) {
        iVar1 = remove("testfile");
        return iVar1;
      }
      goto LAB_001581e5;
    case 4:
      poll_cb_called = iVar1;
      if (iVar3 != -2) goto LAB_001581a9;
      pcStack_d8 = (code *)0x158033;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_001581c2;
      pcStack_d8 = (code *)0x15804d;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&poll_handle,close_cb);
        return extraout_EAX_00;
      }
      goto LAB_001581db;
    }
  }
  else {
    pcStack_d8 = (code *)0x15819a;
    poll_cb_cold_1();
LAB_0015819a:
    pcStack_d8 = (code *)0x15819f;
    poll_cb_cold_2();
LAB_0015819f:
    pcStack_d8 = (code *)0x1581a4;
    poll_cb_cold_22();
LAB_001581a4:
    pcStack_d8 = (code *)0x1581a9;
    poll_cb_cold_21();
LAB_001581a9:
    pcStack_d8 = (code *)0x1581ae;
    poll_cb_cold_3();
LAB_001581ae:
    pcStack_d8 = (code *)0x1581b3;
    poll_cb_cold_9();
LAB_001581b3:
    pcStack_d8 = (code *)0x1581b8;
    poll_cb_cold_6();
LAB_001581b8:
    pcStack_d8 = (code *)0x1581bd;
    poll_cb_cold_17();
LAB_001581bd:
    pcStack_d8 = (code *)0x1581c2;
    poll_cb_cold_13();
LAB_001581c2:
    pcStack_d8 = (code *)0x1581c7;
    poll_cb_cold_5();
LAB_001581c7:
    pcStack_d8 = (code *)0x1581cc;
    poll_cb_cold_12();
LAB_001581cc:
    pcStack_d8 = (code *)0x1581d1;
    poll_cb_cold_8();
LAB_001581d1:
    pcStack_d8 = (code *)0x1581d6;
    poll_cb_cold_18();
LAB_001581d6:
    pcStack_d8 = (code *)0x1581db;
    poll_cb_cold_14();
LAB_001581db:
    pcStack_d8 = (code *)0x1581e0;
    poll_cb_cold_4();
LAB_001581e0:
    pcStack_d8 = (code *)0x1581e5;
    poll_cb_cold_11();
LAB_001581e5:
    pcStack_d8 = (code *)0x1581ea;
    poll_cb_cold_7();
LAB_001581ea:
    pcStack_d8 = (code *)0x1581ef;
    poll_cb_cold_19();
LAB_001581ef:
    pcStack_d8 = (code *)0x1581f4;
    poll_cb_cold_16();
LAB_001581f4:
    pcStack_d8 = (code *)0x1581f9;
    poll_cb_cold_15();
    iVar1 = poll_cb_called;
  }
  poll_cb_called = iVar1;
  pcStack_d8 = run_test_fs_poll_getpath;
  poll_cb_cold_20();
  pcStack_d8 = (code *)in_RCX;
  ::loop = uv_default_loop();
  remove("testfile");
  iVar1 = uv_fs_poll_init(::loop,&poll_handle);
  if (iVar1 == 0) {
    uStack_4e0 = 0x400;
    iVar1 = uv_fs_poll_getpath(&poll_handle,acStack_4d8,&uStack_4e0);
    if (iVar1 != -0x16) goto LAB_00158359;
    iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
    if (iVar1 != 0) goto LAB_0015835e;
    uStack_4e0 = 0x400;
    iVar1 = uv_fs_poll_getpath(&poll_handle,acStack_4d8,&uStack_4e0);
    if (iVar1 != 0) goto LAB_00158363;
    if (acStack_4d8[uStack_4e0 - 1] == '\0') goto LAB_00158368;
    if (acStack_4d8[uStack_4e0] != '\0') goto LAB_0015836d;
    iVar1 = bcmp(acStack_4d8,"testfile",uStack_4e0);
    if (iVar1 != 0) goto LAB_00158372;
    uv_close((uv_handle_t *)&poll_handle,close_cb);
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00158377;
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00158381;
    }
  }
  else {
    run_test_fs_poll_getpath_cold_1();
LAB_00158359:
    run_test_fs_poll_getpath_cold_2();
LAB_0015835e:
    run_test_fs_poll_getpath_cold_3();
LAB_00158363:
    run_test_fs_poll_getpath_cold_4();
LAB_00158368:
    run_test_fs_poll_getpath_cold_10();
LAB_0015836d:
    run_test_fs_poll_getpath_cold_5();
LAB_00158372:
    run_test_fs_poll_getpath_cold_6();
LAB_00158377:
    run_test_fs_poll_getpath_cold_7();
  }
  run_test_fs_poll_getpath_cold_8();
LAB_00158381:
  run_test_fs_poll_getpath_cold_9();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
          ,0x58,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(fs_poll) {
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_fs_poll_init(loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb, FIXTURE, 100));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(poll_cb_called == 5);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}